

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall Net::closing(Net *this)

{
  string request;
  string local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CLOSE","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
  send_with_retry(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  BIO_ctrl((BIO *)this->sock,0x8e,0,(void *)0x0);
  this->closed = 1;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void Net::closing(){
	std::string request="CLOSE";
	send_with_retry(request);
	BIO_shutdown_wr(sock);
	closed=1;
}